

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O1

void __thiscall PatternGeneration::PatternGeneration(PatternGeneration *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  param_type *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  (this->dist).super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->dist).super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (param_type *)operator_new(8);
  __p->_M_a = 0;
  __p->_M_b = 0x7fffffff;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::uniform_int_distribution<int>*>
            (&_Stack_20,(uniform_int_distribution<int> *)__p);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->dist).
            super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->dist).super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)__p;
  (this->dist).super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  return;
}

Assistant:

PatternGeneration::PatternGeneration(){
    dist=std::shared_ptr<std::uniform_int_distribution<int> > (new std::uniform_int_distribution<int> ());
}